

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>::operator()
          (StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImU32 IVar2;
  uint uVar3;
  TransformerLogLin *pTVar4;
  ImPlotPlot *pIVar5;
  ImDrawVert *pIVar6;
  uint *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  double dVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  double dVar13;
  ImVec2 IVar14;
  ImPlotPoint IVar21;
  undefined4 in_XMM1_Da;
  float fVar15;
  undefined4 in_XMM1_Db;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pTVar4 = this->Transformer;
  IVar21.x = (*this->Getter->Getter)(this->Getter->Data,prim + 1);
  pIVar11 = GImPlot;
  dVar13 = log10((double)IVar21.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar11->CurrentPlot;
  dVar10 = (pIVar5->XAxis).Range.Min;
  iVar12 = pTVar4->YAxis;
  IVar1 = pIVar11->PixelRange[iVar12].Min;
  IVar14.x = (float)(pIVar11->Mx *
                     (((double)(float)(dVar13 / pIVar11->LogDenX) *
                       ((pIVar5->XAxis).Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar1.x);
  IVar14.y = (float)(pIVar11->My[iVar12] *
                     ((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - pIVar5->YAxis[iVar12].Range.Min) +
                    (double)IVar1.y);
  fVar15 = (this->P1).x;
  fVar16 = (this->P1).y;
  auVar18._0_4_ = ~-(uint)(IVar14.x <= fVar15) & (uint)IVar14.x;
  auVar18._4_4_ = ~-(uint)(IVar14.y <= fVar16) & (uint)IVar14.y;
  auVar18._8_4_ = ~-(uint)(fVar15 < IVar14.x) & (uint)IVar14.x;
  auVar18._12_4_ = ~-(uint)(fVar16 < IVar14.y) & (uint)IVar14.y;
  auVar8._4_4_ = (uint)fVar16 & -(uint)(IVar14.y <= fVar16);
  auVar8._0_4_ = (uint)fVar15 & -(uint)(IVar14.x <= fVar15);
  auVar8._8_4_ = (uint)fVar15 & -(uint)(fVar15 < IVar14.x);
  auVar8._12_4_ = (uint)fVar16 & -(uint)(fVar16 < IVar14.y);
  auVar18 = auVar18 | auVar8;
  fVar17 = (cull_rect->Min).y;
  auVar9._4_8_ = auVar18._8_8_;
  auVar9._0_4_ = -(uint)(auVar18._4_4_ < fVar17);
  auVar19._0_8_ = auVar9._0_8_ << 0x20;
  auVar19._8_4_ = -(uint)(auVar18._8_4_ < (cull_rect->Max).x);
  auVar19._12_4_ = -(uint)(auVar18._12_4_ < (cull_rect->Max).y);
  auVar20._4_4_ = -(uint)(fVar17 < auVar18._4_4_);
  auVar20._0_4_ = -(uint)((cull_rect->Min).x < auVar18._0_4_);
  auVar20._8_8_ = auVar19._8_8_;
  iVar12 = movmskps((int)pIVar5,auVar20);
  if (iVar12 == 0xf) {
    fVar17 = fVar16 + this->HalfWeight;
    fVar16 = fVar16 - this->HalfWeight;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    (pIVar6->pos).x = fVar15;
    (pIVar6->pos).y = fVar17;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = IVar2;
    pIVar6[1].pos.x = IVar14.x;
    pIVar6[1].pos.y = fVar16;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = IVar2;
    pIVar6[2].pos.x = fVar15;
    pIVar6[2].pos.y = fVar16;
    pIVar6[2].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = IVar2;
    pIVar6[3].pos.x = IVar14.x;
    pIVar6[3].pos.y = fVar17;
    pIVar6[3].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar6 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar7 = DrawList->_IdxWritePtr;
    *puVar7 = uVar3;
    puVar7[1] = uVar3 + 1;
    puVar7[2] = DrawList->_VtxCurrentIdx + 2;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar7[3] = uVar3;
    puVar7[4] = uVar3 + 1;
    puVar7[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar7 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar16 = IVar14.x - this->HalfWeight;
    fVar15 = this->HalfWeight + IVar14.x;
    fVar17 = (this->P1).y;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar6[4].pos.x = fVar16;
    pIVar6[4].pos.y = IVar14.y;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = IVar2;
    pIVar6[1].pos.x = fVar15;
    pIVar6[1].pos.y = fVar17;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = IVar2;
    pIVar6[2].pos.x = fVar16;
    pIVar6[2].pos.y = fVar17;
    pIVar6[2].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = IVar2;
    pIVar6[3].pos.x = fVar15;
    pIVar6[3].pos.y = IVar14.y;
    pIVar6[3].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar6 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar7 = DrawList->_IdxWritePtr;
    *puVar7 = uVar3;
    puVar7[1] = uVar3 + 1;
    puVar7[2] = DrawList->_VtxCurrentIdx + 2;
    uVar3 = DrawList->_VtxCurrentIdx;
    puVar7[3] = uVar3;
    puVar7[4] = uVar3 + 1;
    puVar7[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar7 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar14;
  return (char)iVar12 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }